

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

void Bac_ObjSetIndex(Bac_Ntk_t *p,int i,int x)

{
  int iVar1;
  int x_local;
  int i_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjIndex(p,i);
  if (iVar1 == -1) {
    Vec_IntSetEntry(&p->vIndex,i,x);
    return;
  }
  __assert_fail("Bac_ObjIndex(p, i) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                ,299,"void Bac_ObjSetIndex(Bac_Ntk_t *, int, int)");
}

Assistant:

static inline void           Bac_ObjSetIndex( Bac_Ntk_t * p, int i, int x )  { assert(Bac_ObjIndex(p, i) == -1); Vec_IntSetEntry( &p->vIndex, i, x );                      }